

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_helpers_qpromiseall.cpp
# Opt level: O3

void __thiscall
tst_deprecations_helpers_qpromiseall::atLeastOnePromiseReject_void
          (tst_deprecations_helpers_qpromiseall *this)

{
  QSharedData *pQVar1;
  long lVar2;
  long *plVar3;
  QArrayData *pQVar4;
  PromiseResolver<void> PVar5;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_> QVar6;
  char cVar7;
  bool bVar8;
  QPromise<void> *data;
  PromiseDataBase<void,_void_()> *pPVar9;
  QObject *pQVar10;
  int *piVar11;
  QEvent *this_00;
  long lVar12;
  char *pcVar13;
  char *pcVar14;
  ulong uVar15;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> QVar16;
  long lVar17;
  char *pcVar18;
  QSharedData *pQVar19;
  QByteArrayView QVar20;
  QStringView QVar21;
  QStringView QVar22;
  QArrayData *local_140;
  Data *local_138;
  QArrayData **local_130;
  PromiseResolver<void> resolver;
  _Manager_type local_118;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_108;
  PromiseResolver<void> resolver_1;
  PromiseDataBase<void,_void_()> *local_f8;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_f0;
  _Any_data local_e8;
  undefined **local_d8;
  PromiseDataBase<void,_void_()> *local_d0;
  undefined **local_c8;
  QPromise<void> p;
  QPromise<void> p1;
  QPromise<void> p0;
  QArrayData *local_88;
  storage_type_conflict *psStack_80;
  qsizetype local_78;
  QSharedData *local_68;
  QPromise<void> local_60;
  int *local_50;
  QObject *local_48;
  _func_int **local_40;
  _func_int **local_38;
  
  QtPromise::resolve();
  QtPromise::resolve();
  pPVar9 = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
  pPVar9->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&pPVar9->super_QSharedData = 0;
  (pPVar9->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar9->m_catchers).d.size = 0;
  (pPVar9->m_handlers).d.size = 0;
  (pPVar9->m_catchers).d.d = (Data *)0x0;
  (pPVar9->m_handlers).d.d = (Data *)0x0;
  (pPVar9->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&pPVar9->m_lock = 0;
  *(undefined8 *)&pPVar9->m_settled = 0;
  (pPVar9->m_error).m_data._M_exception_object = (void *)0x0;
  pPVar9->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_0012da30;
  QReadWriteLock::QReadWriteLock(&pPVar9->m_lock,0);
  pPVar9->m_settled = false;
  (pPVar9->m_handlers).d.d = (Data *)0x0;
  (pPVar9->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (pPVar9->m_handlers).d.size = 0;
  (pPVar9->m_catchers).d.d = (Data *)0x0;
  (pPVar9->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar9->m_catchers).d.size = 0;
  (pPVar9->m_error).m_data._M_exception_object = (void *)0x0;
  local_38 = (_func_int **)&PTR__PromiseDataBase_0012d9b8;
  pPVar9->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_0012d9b8;
  LOCK();
  (pPVar9->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pPVar9->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  (pPVar9->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pPVar9->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_68 = &pPVar9->super_QSharedData;
  local_e8._M_unused._M_object = &PTR__QPromiseBase_0012d980;
  local_f8 = pPVar9;
  local_e8._8_8_ = pPVar9;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver,(QPromise<void> *)&local_e8);
  local_40 = (_func_int **)&PTR__PromiseDataBase_0012da30;
  local_e8._M_unused._M_object = &PTR__QPromiseBase_0012d920;
  if ((PromiseDataBase<void,_void_()> *)local_e8._8_8_ != (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    pQVar19 = (QSharedData *)(local_e8._8_8_ + 8);
    (pQVar19->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar19->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar19->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseDataBase<void,_void_()> *)local_e8._8_8_ != (PromiseDataBase<void,_void_()> *)0x0))
    {
      (**(code **)(*(long *)local_e8._8_8_ + 8))();
    }
  }
  PVar5.m_d.d = resolver.m_d.d;
  bVar8 = true;
  if (resolver.m_d.d == (Data *)0x0) {
LAB_00107361:
    QVar16.d = (Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    if (resolver.m_d.d == (Data *)0x0) goto LAB_00107361;
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    bVar8 = false;
    QVar16 = resolver.m_d.d;
  }
  pQVar10 = (QObject *)QThread::currentThread();
  if ((pQVar10 != (QObject *)0x0) &&
     (piVar11 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(pQVar10), local_50 = piVar11
     , local_48 = pQVar10, piVar11 != (int *)0x0)) {
    if ((piVar11[1] != 0) && (cVar7 = QThread::isFinished(), cVar7 == '\0')) {
      if (piVar11[1] == 0) {
        pQVar10 = (QObject *)(QThread *)0x0;
      }
      pQVar10 = (QObject *)QAbstractEventDispatcher::instance((QThread *)pQVar10);
      if ((pQVar10 != (QObject *)0x0) || (cVar7 = QCoreApplication::closingDown(), cVar7 == '\0')) {
        this_00 = (QEvent *)operator_new(0x18);
        QEvent::QEvent(this_00,None);
        *(undefined ***)this_00 = &PTR__Event_0012d7c8;
        *(Data **)(this_00 + 0x10) = QVar16.d;
        if (!bVar8) {
          LOCK();
          ((QVar16.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
               ((QVar16.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
               super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        QCoreApplication::postEvent(pQVar10,this_00,0);
        piVar11 = local_50;
        if (local_50 == (int *)0x0) goto LAB_00107445;
      }
    }
    LOCK();
    *piVar11 = *piVar11 + -1;
    UNLOCK();
    if (*piVar11 == 0) {
      piVar11 = local_50;
      if (local_50 == (int *)0x0) {
        piVar11 = (int *)0x0;
      }
      operator_delete(piVar11);
    }
  }
LAB_00107445:
  if (!bVar8) {
    LOCK();
    ((QVar16.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QVar16.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((QVar16.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
        ._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(QVar16.d,0x10);
    }
    LOCK();
    ((QVar16.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QVar16.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((QVar16.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
        ._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(QVar16.d,0x10);
    }
  }
  if (PVar5.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar5.m_d.d = *(int *)PVar5.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar5.m_d.d == 0) {
      operator_delete((void *)PVar5.m_d.d,0x10);
    }
  }
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver.m_d.d == 0) {
      operator_delete((void *)resolver.m_d.d,0x10);
    }
  }
  if (p0.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar19 = &((p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
               super_QSharedData;
    (pQVar19->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar19->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_e8._M_unused._M_object = &PTR__QPromiseBase_0012d980;
  local_d0 = local_f8;
  LOCK();
  (local_f8->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
  _q_value.super___atomic_base<int>._M_i =
       (local_f8->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_d8 = &PTR__QPromiseBase_0012d980;
  if (p1.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar19 = &((p1.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
               super_QSharedData;
    (pQVar19->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar19->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_c8 = &PTR__QPromiseBase_0012d980;
  lVar12 = QArrayData::allocate((QArrayData **)&resolver,0x10,8,3,KeepSize);
  local_118 = (_Manager_type)0x0;
  uVar15 = 0xfffffffffffffff0;
  do {
    lVar17 = (long)local_118 * 0x10;
    *(undefined ***)(lVar12 + lVar17) = &PTR__QPromiseBase_0012d920;
    lVar2 = *(long *)((long)&local_d0 + uVar15);
    *(long *)(lVar12 + 8 + lVar17) = lVar2;
    if (lVar2 != 0) {
      LOCK();
      *(int *)(lVar2 + 8) = *(int *)(lVar2 + 8) + 1;
      UNLOCK();
    }
    *(undefined ***)(lVar17 + lVar12) = &PTR__QPromiseBase_0012d980;
    local_118 = local_118 + 1;
    uVar15 = uVar15 + 0x10;
  } while (uVar15 < 0x20);
  QtPromise::all<QList>((QtPromise *)&p,(QList<QtPromise::QPromise<void>_> *)&resolver);
  QArrayDataPointer<QtPromise::QPromise<void>_>::~QArrayDataPointer
            ((QArrayDataPointer<QtPromise::QPromise<void>_> *)&resolver);
  lVar12 = 0x30;
  do {
    *(undefined ***)((long)&local_f8 + lVar12) = &PTR__QPromiseBase_0012d920;
    lVar2 = *(long *)((long)&local_f0.d + lVar12);
    if (lVar2 != 0) {
      LOCK();
      piVar11 = (int *)(lVar2 + 8);
      *piVar11 = *piVar11 + -1;
      UNLOCK();
      if ((*piVar11 == 0) &&
         (plVar3 = *(long **)((long)&local_f0.d + lVar12), plVar3 != (long *)0x0)) {
        (**(code **)(*plVar3 + 8))();
      }
    }
    lVar12 = lVar12 + -0x10;
  } while (lVar12 != 0);
  bVar8 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                    (&(p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>);
  bVar8 = (bool)(~bVar8 & ((p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>
                          ).m_error.m_data._M_exception_object == (void *)0x0);
  resolver.m_d.d._0_1_ = 1;
  local_e8._M_pod_data[0] = bVar8;
  pcVar13 = QTest::toString<bool>((bool *)local_e8._M_pod_data);
  pcVar14 = QTest::toString<bool>((bool *)&resolver);
  cVar7 = QTest::compare_helper
                    (bVar8,"Compared values are not the same",pcVar13,pcVar14,"p0.isFulfilled()",
                     "true",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                     ,0xae);
  if (cVar7 == '\0') goto LAB_00107bc5;
  bVar8 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                    (&(p1.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>);
  bVar8 = (bool)(~bVar8 & ((p1.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>
                          ).m_error.m_data._M_exception_object == (void *)0x0);
  resolver.m_d.d._0_1_ = 1;
  local_e8._M_pod_data[0] = bVar8;
  pcVar13 = QTest::toString<bool>((bool *)local_e8._M_pod_data);
  pcVar14 = QTest::toString<bool>((bool *)&resolver);
  cVar7 = QTest::compare_helper
                    (bVar8,"Compared values are not the same",pcVar13,pcVar14,"p1.isFulfilled()",
                     "true",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                     ,0xaf);
  if (cVar7 == '\0') goto LAB_00107bc5;
  bVar8 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(local_f8);
  resolver.m_d.d._0_1_ = 1;
  local_e8._M_pod_data[0] = bVar8;
  pcVar13 = QTest::toString<bool>((bool *)local_e8._M_pod_data);
  pcVar14 = QTest::toString<bool>((bool *)&resolver);
  cVar7 = QTest::compare_helper
                    (bVar8,"Compared values are not the same",pcVar13,pcVar14,"p2.isPending()",
                     "true",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                     ,0xb0);
  if (cVar7 == '\0') goto LAB_00107bc5;
  bVar8 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                    (&(p.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>);
  resolver.m_d.d._0_1_ = 1;
  local_e8._M_pod_data[0] = bVar8;
  pcVar13 = QTest::toString<bool>((bool *)local_e8._M_pod_data);
  pcVar14 = QTest::toString<bool>((bool *)&resolver);
  pcVar18 = "p.isPending()";
  cVar7 = QTest::compare_helper
                    (bVar8,"Compared values are not the same",pcVar13,pcVar14,"p.isPending()","true"
                     ,
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                     ,0xb1);
  if (cVar7 == '\0') goto LAB_00107bc5;
  local_88 = (QArrayData *)0x0;
  psStack_80 = (storage_type_conflict *)0x0;
  local_78 = 0;
  pPVar9 = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
  pPVar9->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&pPVar9->super_QSharedData = 0;
  (pPVar9->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar9->m_catchers).d.size = 0;
  (pPVar9->m_handlers).d.size = 0;
  (pPVar9->m_catchers).d.d = (Data *)0x0;
  (pPVar9->m_handlers).d.d = (Data *)0x0;
  (pPVar9->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&pPVar9->m_lock = 0;
  *(undefined8 *)&pPVar9->m_settled = 0;
  (pPVar9->m_error).m_data._M_exception_object = (void *)0x0;
  pPVar9->_vptr_PromiseDataBase = local_40;
  QReadWriteLock::QReadWriteLock(&pPVar9->m_lock,0);
  pPVar9->m_settled = false;
  (pPVar9->m_handlers).d.d = (Data *)0x0;
  (pPVar9->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (pPVar9->m_handlers).d.size = 0;
  (pPVar9->m_catchers).d.d = (Data *)0x0;
  (pPVar9->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar9->m_catchers).d.size = 0;
  (pPVar9->m_error).m_data._M_exception_object = (void *)0x0;
  pPVar9->_vptr_PromiseDataBase = local_38;
  LOCK();
  (pPVar9->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pPVar9->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  pQVar19 = &pPVar9->super_QSharedData;
  LOCK();
  (pPVar9->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pPVar9->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_60.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012d980;
  local_60.super_QPromiseBase<void>.m_d.d = (PromiseData<void> *)pPVar9;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver_1,&local_60);
  local_60.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012d920;
  if (&(local_60.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()> !=
      (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    pQVar1 = &((local_60.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (&(local_60.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()> !=
        (PromiseDataBase<void,_void_()> *)0x0)) {
      (*((local_60.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
        _vptr_PromiseDataBase[1])();
    }
  }
  QVar6.d = p.super_QPromiseBase<void>.m_d.d;
  if (resolver_1.m_d.d == (Data *)0x0) {
    local_108.d = (Data *)0x0;
LAB_00107895:
    local_f0.d = (Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
    local_108 = resolver_1.m_d.d;
    if (resolver_1.m_d.d == (Data *)0x0) goto LAB_00107895;
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
    local_f0 = resolver_1.m_d.d;
  }
  QtPromisePrivate::PromiseHandler<void,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>
            ((function<void_(const_int_&)> *)&local_e8,
             (PromiseHandler<void,decltype(nullptr),void> *)0x0,&local_108,
             (QPromiseResolve<void> *)&local_f0,(QPromiseReject<void> *)pcVar18);
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addHandler
            (&(QVar6.d)->super_PromiseDataBase<void,_void_()>,
             (function<void_(const_int_&)> *)&local_e8);
  if (local_d8 != (undefined **)0x0) {
    (*(code *)local_d8)(&local_e8,&local_e8,__destroy_functor);
  }
  local_140 = (QArrayData *)local_108.d;
  if ((QArrayData *)local_108.d != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)&(local_108.d)->super_QSharedData)->_q_value).super___atomic_base<int>._M_i
         = (((QBasicAtomicInt *)&(local_108.d)->super_QSharedData)->_q_value).
           super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_138 = local_f0.d;
  if (local_f0.d != (Data *)0x0) {
    LOCK();
    *(int *)&((QPromiseBase<void> *)&(local_f0.d)->super_QSharedData)->_vptr_QPromiseBase =
         *(int *)&((QPromiseBase<void> *)&(local_f0.d)->super_QSharedData)->_vptr_QPromiseBase + 1;
    UNLOCK();
  }
  local_130 = &local_88;
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)(Data *)0x0;
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
       operator_new(0x18);
  *(QArrayData **)resolver.m_d.d = local_140;
  if (local_140 != (QArrayData *)0x0) {
    LOCK();
    (local_140->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_140->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  ((Data *)resolver.m_d.d)->promise = (QPromise<void> *)local_138;
  if (local_138 == (Data *)0x0) {
    *(QArrayData ***)((long)resolver.m_d.d + 0x10) = local_130;
  }
  else {
    LOCK();
    *(int *)&((QPromiseBase<void> *)&local_138->super_QSharedData)->_vptr_QPromiseBase =
         *(int *)&((QPromiseBase<void> *)&local_138->super_QSharedData)->_vptr_QPromiseBase + 1;
    UNLOCK();
    *(QArrayData ***)((long)resolver.m_d.d + 0x10) = local_130;
    if (local_138 != (Data *)0x0) {
      LOCK();
      *(int *)&((QPromiseBase<void> *)&local_138->super_QSharedData)->_vptr_QPromiseBase =
           *(int *)&((QPromiseBase<void> *)&local_138->super_QSharedData)->_vptr_QPromiseBase + -1;
      UNLOCK();
      if (*(int *)&((QPromiseBase<void> *)&local_138->super_QSharedData)->_vptr_QPromiseBase == 0) {
        operator_delete(local_138,0x10);
      }
    }
  }
  if (local_140 != (QArrayData *)0x0) {
    LOCK();
    (local_140->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_140->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_140->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_140,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addCatcher
            (&(QVar6.d)->super_PromiseDataBase<void,_void_()>,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&resolver);
  std::
  _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
  ::_M_manager((_Any_data *)&resolver,(_Any_data *)&resolver,__destroy_functor);
  if (local_f0.d != (Data *)0x0) {
    LOCK();
    *(int *)&((QPromiseBase<void> *)&(local_f0.d)->super_QSharedData)->_vptr_QPromiseBase =
         *(int *)&((QPromiseBase<void> *)&(local_f0.d)->super_QSharedData)->_vptr_QPromiseBase + -1;
    UNLOCK();
    if (*(int *)&((QPromiseBase<void> *)&(local_f0.d)->super_QSharedData)->_vptr_QPromiseBase == 0)
    {
      operator_delete(local_f0.d,0x10);
    }
  }
  if ((QArrayData *)local_108.d != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)&(local_108.d)->super_QSharedData)->_q_value).super___atomic_base<int>._M_i
         = (((QBasicAtomicInt *)&(local_108.d)->super_QSharedData)->_q_value).
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)&(local_108.d)->super_QSharedData)->_q_value).super___atomic_base<int>.
        _M_i == 0) {
      operator_delete(local_108.d,0x10);
    }
  }
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver_1.m_d.d == 0) {
      operator_delete((void *)resolver_1.m_d.d,0x10);
    }
  }
  QVar6.d = p.super_QPromiseBase<void>.m_d.d;
  bVar8 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                    (&(p.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>);
  if (!bVar8) {
    QtPromisePrivate::PromiseDataBase<void,_void_()>::dispatch
              (&(QVar6.d)->super_PromiseDataBase<void,_void_()>);
  }
  bVar8 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(pPVar9);
  while (bVar8 != false) {
    QCoreApplication::processEvents();
    QCoreApplication::sendPostedEvents((QObject *)0x0,0x34);
    bVar8 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(pPVar9);
  }
  LOCK();
  (pQVar19->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar19->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  (pQVar19->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar19->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar19->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*pPVar9->_vptr_PromiseDataBase[1])(pPVar9);
  }
  LOCK();
  (pQVar19->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar19->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar19->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*pPVar9->_vptr_PromiseDataBase[1])(pPVar9);
  }
  QVar20.m_data = (storage_type *)0x3;
  QVar20.m_size = (qsizetype)&local_140;
  QString::fromUtf8(QVar20);
  pQVar4 = local_140;
  QVar21.m_data = psStack_80;
  QVar21.m_size = local_78;
  QVar22.m_data = (storage_type_conflict *)local_138;
  QVar22.m_size = (qsizetype)local_130;
  cVar7 = QTest::qCompare(QVar21,QVar22,"waitForError(p, QString{})","QString{\"foo\"}",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                          ,0xb2);
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar4,2,8);
    }
  }
  if (local_88 != (QArrayData *)0x0) {
    LOCK();
    (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_88,2,8);
    }
  }
  pPVar9 = local_f8;
  if (cVar7 != '\0') {
    bVar8 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(local_f8);
    bVar8 = (bool)(~bVar8 & (pPVar9->m_error).m_data._M_exception_object != (void *)0x0);
    local_140 = (QArrayData *)CONCAT71(local_140._1_7_,bVar8);
    local_88 = (QArrayData *)CONCAT71(local_88._1_7_,1);
    pcVar13 = QTest::toString<bool>((bool *)&local_140);
    pcVar14 = QTest::toString<bool>((bool *)&local_88);
    QTest::compare_helper
              (bVar8,"Compared values are not the same",pcVar13,pcVar14,"p2.isRejected()","true",
               "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
               ,0xb3);
  }
LAB_00107bc5:
  p.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0012d920;
  if (p.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar19 = &((p.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
               super_QSharedData;
    (pQVar19->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar19->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar19->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0)) {
      (*((p.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
        _vptr_PromiseDataBase[1])();
    }
  }
  LOCK();
  (local_68->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (local_68->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((local_68->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*local_f8->_vptr_PromiseDataBase[1])();
  }
  if (p1.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar19 = &((p1.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
               super_QSharedData;
    (pQVar19->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar19->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar19->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p1.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0)) {
      (*((p1.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
        _vptr_PromiseDataBase[1])();
    }
  }
  if (p0.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar19 = &((p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
               super_QSharedData;
    (pQVar19->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar19->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar19->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p0.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0)) {
      (*((p0.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
        _vptr_PromiseDataBase[1])();
    }
  }
  return;
}

Assistant:

void tst_deprecations_helpers_qpromiseall::atLeastOnePromiseReject_void()
{
    auto p0 = QtPromise::resolve();
    auto p1 = QtPromise::resolve();
    auto p2 = QtPromise::QPromise<void>{
        [](const QtPromise::QPromiseResolve<void>&, const QtPromise::QPromiseReject<void>& reject) {
            QtPromisePrivate::qtpromise_defer([=]() {
                reject(QString{"foo"});
            });
        }};

    auto p = QtPromise::qPromiseAll(QVector<QtPromise::QPromise<void>>{p0, p2, p1});

    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<void>>::value));
    QCOMPARE(p0.isFulfilled(), true);
    QCOMPARE(p1.isFulfilled(), true);
    QCOMPARE(p2.isPending(), true);
    QCOMPARE(p.isPending(), true);
    QCOMPARE(waitForError(p, QString{}), QString{"foo"});
    QCOMPARE(p2.isRejected(), true);
}